

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O1

Expression * __thiscall wasm::AlignmentLowering::lowerLoadI32(AlignmentLowering *this,Load *curr)

{
  Name *pNVar1;
  ulong uVar2;
  address64_t aVar3;
  undefined1 auVar4 [16];
  Index IVar5;
  Memory *pMVar6;
  undefined4 *puVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  Binary *pBVar10;
  Binary *pBVar11;
  Const *pCVar12;
  Binary *this_00;
  Type in_R8;
  LocalSet *local_88;
  Binary *local_80;
  AlignmentLowering *local_78;
  Name *local_70;
  initializer_list<wasm::Expression_*> local_68;
  Const *local_50;
  Binary *local_48;
  Index local_3c;
  Builder local_38;
  Builder builder;
  
  uVar2 = (curr->align).addr;
  if ((uVar2 != 0) && (uVar2 != curr->bytes)) {
    pMVar6 = Module::getMemory((this->
                               super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .
                               super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .currModule,(Name)(curr->memory).super_IString.str);
    uVar2 = (pMVar6->indexType).id;
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
         ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
         super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
         currModule;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id != 2) {
      __assert_fail("curr->type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                    ,0x28,"Expression *wasm::AlignmentLowering::lowerLoadI32(Load *)");
    }
    pNVar1 = &curr->memory;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar2;
    IVar5 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
    local_70 = pNVar1;
    local_50 = (Const *)uVar2;
    local_3c = IVar5;
    if (curr->bytes == '\x04') {
      aVar3 = (curr->align).addr;
      if (aVar3 == 2) {
        local_48 = (Binary *)(curr->offset).addr;
        puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        *puVar7 = 8;
        puVar7[4] = IVar5;
        *(ulong *)(puVar7 + 2) = uVar2;
        local_68._M_array = (iterator)(pNVar1->super_IString).str._M_len;
        local_68._M_len = (size_type)(curr->memory).super_IString.str._M_str;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
        pEVar8->_id = LoadId;
        pEVar8[1].type.id = 0;
        *(undefined8 *)(pEVar8 + 2) = 0;
        *(undefined1 *)&pEVar8[2].type.id = 0;
        *(undefined2 *)&pEVar8[1]._id = IfId;
        pEVar8[1].type.id = (uintptr_t)local_48;
        *(undefined8 *)(pEVar8 + 2) = 2;
        *(undefined4 **)(pEVar8 + 3) = puVar7;
        (pEVar8->type).id = 2;
        pEVar8[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar8 + 4) = local_68._M_len;
        local_48 = (Binary *)((curr->offset).addr + 2);
        puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        *puVar7 = 8;
        puVar7[4] = IVar5;
        *(Const **)(puVar7 + 2) = local_50;
        local_68._M_array = (iterator)(local_70->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_70->super_IString).str._M_str;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
        pEVar9->_id = LoadId;
        pEVar9[1].type.id = 0;
        *(undefined8 *)(pEVar9 + 2) = 0;
        *(undefined1 *)&pEVar9[2].type.id = 0;
        *(undefined2 *)&pEVar9[1]._id = IfId;
        pEVar9[1].type.id = (uintptr_t)local_48;
        *(undefined8 *)(pEVar9 + 2) = 2;
        *(undefined4 **)(pEVar9 + 3) = puVar7;
        (pEVar9->type).id = 2;
        pEVar9[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar9 + 4) = local_68._M_len;
        local_50 = Builder::makeConst<int>(&local_38,0x10);
        pBVar10 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar10->op = ShlInt32;
        pBVar10->left = pEVar9;
        pBVar10->right = (Expression *)local_50;
        Binary::finalize(pBVar10);
        pBVar11 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar11->op = OrInt32;
        pBVar11->left = pEVar8;
      }
      else {
        if (aVar3 != 1) {
          handle_unreachable("invalid alignment",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                             ,0x84);
        }
        local_48 = (Binary *)(curr->offset).addr;
        puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        *puVar7 = 8;
        puVar7[4] = IVar5;
        *(ulong *)(puVar7 + 2) = uVar2;
        local_68._M_array = (iterator)(pNVar1->super_IString).str._M_len;
        local_68._M_len = (size_type)(curr->memory).super_IString.str._M_str;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
        pEVar8->_id = LoadId;
        pEVar8[1].type.id = 0;
        *(undefined8 *)(pEVar8 + 2) = 0;
        *(undefined1 *)&pEVar8[2].type.id = 0;
        *(undefined2 *)&pEVar8[1]._id = BlockId;
        pEVar8[1].type.id = (uintptr_t)local_48;
        *(undefined8 *)(pEVar8 + 2) = 1;
        *(undefined4 **)(pEVar8 + 3) = puVar7;
        (pEVar8->type).id = 2;
        pEVar8[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar8 + 4) = local_68._M_len;
        aVar3 = (curr->offset).addr;
        puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        *puVar7 = 8;
        puVar7[4] = local_3c;
        *(Const **)(puVar7 + 2) = local_50;
        local_68._M_array = (iterator)(local_70->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_70->super_IString).str._M_str;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
        pEVar9->_id = LoadId;
        pEVar9[1].type.id = 0;
        *(undefined8 *)(pEVar9 + 2) = 0;
        *(undefined1 *)&pEVar9[2].type.id = 0;
        *(undefined2 *)&pEVar9[1]._id = BlockId;
        pEVar9[1].type.id = aVar3 + 1;
        *(undefined8 *)(pEVar9 + 2) = 1;
        *(undefined4 **)(pEVar9 + 3) = puVar7;
        (pEVar9->type).id = 2;
        pEVar9[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar9 + 4) = local_68._M_len;
        local_48 = (Binary *)Builder::makeConst<int>(&local_38,8);
        pBVar11 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar11->op = ShlInt32;
        pBVar11->left = pEVar9;
        pBVar11->right = (Expression *)local_48;
        Binary::finalize(pBVar11);
        local_48 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (local_48->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (local_48->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        local_48->op = OrInt32;
        local_48->left = pEVar8;
        local_48->right = (Expression *)pBVar11;
        Binary::finalize(local_48);
        aVar3 = (curr->offset).addr;
        puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        *puVar7 = 8;
        puVar7[4] = local_3c;
        *(Const **)(puVar7 + 2) = local_50;
        local_68._M_array = (iterator)(local_70->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_70->super_IString).str._M_str;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
        pEVar8->_id = LoadId;
        pEVar8[1].type.id = 0;
        *(undefined8 *)(pEVar8 + 2) = 0;
        *(undefined1 *)&pEVar8[2].type.id = 0;
        *(undefined2 *)&pEVar8[1]._id = BlockId;
        pEVar8[1].type.id = aVar3 + 2;
        *(undefined8 *)(pEVar8 + 2) = 1;
        *(undefined4 **)(pEVar8 + 3) = puVar7;
        (pEVar8->type).id = 2;
        pEVar8[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar8 + 4) = local_68._M_len;
        pCVar12 = Builder::makeConst<int>(&local_38,0x10);
        pBVar11 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar11->op = ShlInt32;
        pBVar11->left = pEVar8;
        pBVar11->right = (Expression *)pCVar12;
        Binary::finalize(pBVar11);
        aVar3 = (curr->offset).addr;
        puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        *puVar7 = 8;
        puVar7[4] = local_3c;
        *(Const **)(puVar7 + 2) = local_50;
        local_68._M_array = (iterator)(local_70->super_IString).str._M_len;
        local_68._M_len = (size_type)(local_70->super_IString).str._M_str;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
        pEVar8->_id = LoadId;
        pEVar8[1].type.id = 0;
        *(undefined8 *)(pEVar8 + 2) = 0;
        *(undefined1 *)&pEVar8[2].type.id = 0;
        *(undefined2 *)&pEVar8[1]._id = BlockId;
        pEVar8[1].type.id = aVar3 + 3;
        *(undefined8 *)(pEVar8 + 2) = 1;
        *(undefined4 **)(pEVar8 + 3) = puVar7;
        (pEVar8->type).id = 2;
        pEVar8[3].type.id = (uintptr_t)local_68._M_array;
        *(size_type *)(pEVar8 + 4) = local_68._M_len;
        local_50 = Builder::makeConst<int>(&local_38,0x18);
        this_00 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        this_00->op = ShlInt32;
        this_00->left = pEVar8;
        this_00->right = (Expression *)local_50;
        Binary::finalize(this_00);
        pBVar10 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar10->op = OrInt32;
        pBVar10->left = (Expression *)pBVar11;
        pBVar10->right = (Expression *)this_00;
        Binary::finalize(pBVar10);
        pBVar11 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar11->op = OrInt32;
        pBVar11->left = (Expression *)local_48;
      }
      pBVar11->right = (Expression *)pBVar10;
      Binary::finalize(pBVar11);
    }
    else {
      local_78 = this;
      if (curr->bytes != '\x02') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0x87);
      }
      local_48 = (Binary *)(curr->offset).addr;
      puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *puVar7 = 8;
      puVar7[4] = IVar5;
      *(ulong *)(puVar7 + 2) = uVar2;
      local_68._M_array = (iterator)(pNVar1->super_IString).str._M_len;
      local_68._M_len = (size_type)(curr->memory).super_IString.str._M_str;
      pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
      pEVar8->_id = LoadId;
      pEVar8[1].type.id = 0;
      *(undefined8 *)(pEVar8 + 2) = 0;
      *(undefined1 *)&pEVar8[2].type.id = 0;
      *(undefined2 *)&pEVar8[1]._id = BlockId;
      pEVar8[1].type.id = (uintptr_t)local_48;
      *(undefined8 *)(pEVar8 + 2) = 1;
      *(undefined4 **)(pEVar8 + 3) = puVar7;
      (pEVar8->type).id = 2;
      pEVar8[3].type.id = (uintptr_t)local_68._M_array;
      *(size_type *)(pEVar8 + 4) = local_68._M_len;
      aVar3 = (curr->offset).addr;
      puVar7 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *puVar7 = 8;
      puVar7[4] = IVar5;
      *(Const **)(puVar7 + 2) = local_50;
      local_68._M_array = (iterator)(local_70->super_IString).str._M_len;
      local_68._M_len = (size_type)(local_70->super_IString).str._M_str;
      pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
      pEVar9->_id = LoadId;
      pEVar9[1].type.id = 0;
      *(undefined8 *)(pEVar9 + 2) = 0;
      *(undefined1 *)&pEVar9[2].type.id = 0;
      *(undefined2 *)&pEVar9[1]._id = BlockId;
      pEVar9[1].type.id = aVar3 + 1;
      *(undefined8 *)(pEVar9 + 2) = 1;
      *(undefined4 **)(pEVar9 + 3) = puVar7;
      (pEVar9->type).id = 2;
      pEVar9[3].type.id = (uintptr_t)local_68._M_array;
      *(size_type *)(pEVar9 + 4) = local_68._M_len;
      local_50 = Builder::makeConst<int>(&local_38,8);
      pBVar10 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar10->op = ShlInt32;
      pBVar10->left = pEVar9;
      pBVar10->right = (Expression *)local_50;
      Binary::finalize(pBVar10);
      pBVar11 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar11->op = OrInt32;
      pBVar11->left = pEVar8;
      pBVar11->right = (Expression *)pBVar10;
      Binary::finalize(pBVar11);
      if (curr->signed_ == true) {
        pBVar11 = (Binary *)
                  Bits::makeSignExt((Expression *)pBVar11,2,
                                    (local_78->
                                    super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                                    .
                                    super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                                    .currModule);
      }
    }
    local_88 = Builder::makeLocalSet(&local_38,local_3c,curr->ptr);
    local_68._M_array = (iterator)&local_88;
    local_68._M_len = 2;
    local_80 = pBVar11;
    curr = (Load *)Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             (&local_38,&local_68);
  }
  return (Expression *)curr;
}

Assistant:

Expression* lowerLoadI32(Load* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    Builder builder(*getModule());
    assert(curr->type == Type::i32);
    auto temp = builder.addVar(getFunction(), indexType);
    Expression* ret;
    if (curr->bytes == 2) {
      ret = builder.makeBinary(
        OrInt32,
        builder.makeLoad(1,
                         false,
                         curr->offset,
                         1,
                         builder.makeLocalGet(temp, indexType),
                         Type::i32,
                         curr->memory),
        builder.makeBinary(
          ShlInt32,
          builder.makeLoad(1,
                           false,
                           curr->offset + 1,
                           1,
                           builder.makeLocalGet(temp, indexType),
                           Type::i32,
                           curr->memory),
          builder.makeConst(int32_t(8))));
      if (curr->signed_) {
        ret = Bits::makeSignExt(ret, 2, *getModule());
      }
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        ret = builder.makeBinary(
          OrInt32,
          builder.makeBinary(
            OrInt32,
            builder.makeLoad(1,
                             false,
                             curr->offset,
                             1,
                             builder.makeLocalGet(temp, indexType),
                             Type::i32,
                             curr->memory),
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 1,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(8)))),
          builder.makeBinary(
            OrInt32,
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 2,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(16))),
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 3,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(24)))));
      } else if (curr->align == 2) {
        ret = builder.makeBinary(
          OrInt32,
          builder.makeLoad(2,
                           false,
                           curr->offset,
                           2,
                           builder.makeLocalGet(temp, indexType),
                           Type::i32,
                           curr->memory),
          builder.makeBinary(
            ShlInt32,
            builder.makeLoad(2,
                             false,
                             curr->offset + 2,
                             2,
                             builder.makeLocalGet(temp, indexType),
                             Type::i32,
                             curr->memory),
            builder.makeConst(int32_t(16))));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    return builder.makeBlock({builder.makeLocalSet(temp, curr->ptr), ret});
  }